

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O1

ON_ScaleValue *
ON_ScaleValue::Create
          (ON_ScaleValue *__return_storage_ptr__,ON_LengthValue *left_side_length,
          ON_LengthValue *right_side_length,ScaleStringFormat string_format_preference)

{
  ON_UnitSystem *this;
  ON_UnitSystem *this_00;
  StringFormat SVar1;
  undefined3 uVar2;
  uint uVar3;
  bool bVar4;
  LengthUnitSystem context_unit_system;
  LengthUnitSystem context_unit_system_00;
  ON_ScaleValue *pOVar5;
  wchar_t *pwVar6;
  ScaleStringFormat SVar7;
  wchar_t *pwVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double y;
  double x;
  double local_58;
  double local_50;
  double local_48;
  ON_wString *local_40;
  ON_wString *local_38;
  
  ON_ScaleValue(__return_storage_ptr__,&Unset);
  SVar1 = left_side_length->m_string_format;
  (__return_storage_ptr__->m_left_length).m_context_angle_unit_system =
       left_side_length->m_context_angle_unit_system;
  (__return_storage_ptr__->m_left_length).m_string_format = SVar1;
  (__return_storage_ptr__->m_left_length).m_context_locale_id =
       left_side_length->m_context_locale_id;
  uVar2 = *(undefined3 *)&(left_side_length->m_length_unit_system).field_0x1;
  uVar3 = (left_side_length->m_length_unit_system).m_reserved;
  dVar9 = (left_side_length->m_length_unit_system).m_meters_per_custom_unit;
  (__return_storage_ptr__->m_left_length).m_length_unit_system.m_unit_system =
       (left_side_length->m_length_unit_system).m_unit_system;
  *(undefined3 *)&(__return_storage_ptr__->m_left_length).m_length_unit_system.field_0x1 = uVar2;
  (__return_storage_ptr__->m_left_length).m_length_unit_system.m_reserved = uVar3;
  (__return_storage_ptr__->m_left_length).m_length_unit_system.m_meters_per_custom_unit = dVar9;
  ON_wString::operator=
            (&(__return_storage_ptr__->m_left_length).m_length_unit_system.m_custom_unit_name,
             &(left_side_length->m_length_unit_system).m_custom_unit_name);
  (__return_storage_ptr__->m_left_length).m_length = left_side_length->m_length;
  local_38 = &(__return_storage_ptr__->m_left_length).m_length_as_string;
  ON_wString::operator=(local_38,&left_side_length->m_length_as_string);
  SVar1 = right_side_length->m_string_format;
  (__return_storage_ptr__->m_right_length).m_context_angle_unit_system =
       right_side_length->m_context_angle_unit_system;
  (__return_storage_ptr__->m_right_length).m_string_format = SVar1;
  (__return_storage_ptr__->m_right_length).m_context_locale_id =
       right_side_length->m_context_locale_id;
  uVar2 = *(undefined3 *)&(right_side_length->m_length_unit_system).field_0x1;
  uVar3 = (right_side_length->m_length_unit_system).m_reserved;
  dVar9 = (right_side_length->m_length_unit_system).m_meters_per_custom_unit;
  (__return_storage_ptr__->m_right_length).m_length_unit_system.m_unit_system =
       (right_side_length->m_length_unit_system).m_unit_system;
  *(undefined3 *)&(__return_storage_ptr__->m_right_length).m_length_unit_system.field_0x1 = uVar2;
  (__return_storage_ptr__->m_right_length).m_length_unit_system.m_reserved = uVar3;
  (__return_storage_ptr__->m_right_length).m_length_unit_system.m_meters_per_custom_unit = dVar9;
  ON_wString::operator=
            (&(__return_storage_ptr__->m_right_length).m_length_unit_system.m_custom_unit_name,
             &(right_side_length->m_length_unit_system).m_custom_unit_name);
  (__return_storage_ptr__->m_right_length).m_length = right_side_length->m_length;
  local_40 = &(__return_storage_ptr__->m_right_length).m_length_as_string;
  ON_wString::operator=(local_40,&right_side_length->m_length_as_string);
  __return_storage_ptr__->m_string_format_preference = string_format_preference;
  bVar4 = ON_LengthValue::IsSet(&__return_storage_ptr__->m_left_length);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  bVar4 = ON_LengthValue::IsSet(&__return_storage_ptr__->m_right_length);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  this = &(__return_storage_ptr__->m_left_length).m_length_unit_system;
  context_unit_system = ON_UnitSystem::UnitSystem(this);
  this_00 = &(__return_storage_ptr__->m_right_length).m_length_unit_system;
  context_unit_system_00 = ON_UnitSystem::UnitSystem(this_00);
  dVar9 = ON_LengthValue::Length(&__return_storage_ptr__->m_left_length,context_unit_system);
  dVar10 = ON_LengthValue::Length(&__return_storage_ptr__->m_right_length,context_unit_system_00);
  if ((dVar9 <= 0.0) || (dVar10 <= 0.0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x5c5,"","Invalid input");
    return __return_storage_ptr__;
  }
  local_48 = ON::UnitScale(this,this_00);
  dVar11 = ON::UnitScale(this_00,this);
  if ((local_48 <= 0.0) || (dVar11 <= 0.0)) {
LAB_005cc616:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x5e6,"","Invalid input");
    return __return_storage_ptr__;
  }
  dVar12 = ON_InternalDefuzz(1e-14,local_48 * dVar11);
  if ((dVar12 != 1.0) || (NAN(dVar12))) goto LAB_005cc616;
  local_58 = dVar10;
  if (local_48 <= dVar11) {
    local_50 = dVar9;
    if (local_48 < dVar11) {
      local_58 = dVar10 * dVar11;
    }
  }
  else {
    local_50 = dVar9 * local_48;
  }
  if ((local_50 <= 0.0) || (local_58 <= 0.0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x5f5,"","Invalid input");
    return __return_storage_ptr__;
  }
  bVar4 = ON_Internal_SimplifyRatio(&local_50,&local_58);
  dVar10 = local_50;
  dVar9 = local_58;
  SVar7 = EquationFormat;
  if (bVar4) {
    SVar7 = string_format_preference;
  }
  dVar11 = ON_InternalQuotient(0.0,local_50,local_58);
  __return_storage_ptr__->m_left_to_right_scale = dVar11;
  dVar12 = ON_InternalQuotient(0.0,dVar9,dVar10);
  __return_storage_ptr__->m_right_to_left_scale = dVar12;
  dVar11 = __return_storage_ptr__->m_left_to_right_scale;
  dVar13 = floor(dVar11);
  if (((dVar11 < 2.0) || (dVar13 != dVar11)) || (NAN(dVar13) || NAN(dVar11))) {
    dVar11 = floor(dVar12);
    if (2.0 <= dVar12) {
      if ((dVar11 == dVar12) && (pOVar5 = __return_storage_ptr__, !NAN(dVar11) && !NAN(dVar12)))
      goto LAB_005cc7c5;
    }
  }
  else {
    pOVar5 = (ON_ScaleValue *)&__return_storage_ptr__->m_right_to_left_scale;
    dVar12 = dVar11;
LAB_005cc7c5:
    pOVar5->m_left_to_right_scale = 1.0 / dVar12;
  }
  if (SVar7 == RatioFormat) {
    pwVar8 = L"%.17g:%.17g";
  }
  else {
    if (SVar7 != FractionFormat) {
      ON_wString::IsValid(local_38,true);
      pwVar8 = ON_wString::operator_cast_to_wchar_t_(local_38);
      ON_wString::IsValid(local_40,true);
      pwVar6 = ON_wString::operator_cast_to_wchar_t_(local_40);
      ON_wString::Format(&__return_storage_ptr__->m_scale_as_string,L"%ls = %ls",pwVar8,pwVar6);
      goto LAB_005cc852;
    }
    pwVar8 = L"%.17g/%.17g";
  }
  ON_wString::Format(&__return_storage_ptr__->m_scale_as_string,pwVar8,dVar10,dVar9);
LAB_005cc852:
  __return_storage_ptr__->m_string_format_preference = SVar7;
  return __return_storage_ptr__;
}

Assistant:

ON_ScaleValue ON_ScaleValue::Create(
  const class ON_LengthValue& left_side_length,
  const class ON_LengthValue& right_side_length,
  ON_ScaleValue::ScaleStringFormat string_format_preference
)
{
  ON_ScaleValue scale_value = ON_ScaleValue::Unset;

  scale_value.m_left_length = left_side_length;
  scale_value.m_right_length = right_side_length;
  scale_value.m_string_format_preference = string_format_preference;

  if (scale_value.m_left_length.IsUnset() || scale_value.m_right_length.IsUnset())
    return scale_value;

  ON::LengthUnitSystem left_length_unit_system = scale_value.m_left_length.LengthUnitSystem().UnitSystem();
  ON::LengthUnitSystem right_length_unit_system = scale_value.m_right_length.LengthUnitSystem().UnitSystem();
  const double left_length = scale_value.m_left_length.Length(left_length_unit_system);
  const double right_length = scale_value.m_right_length.Length(right_length_unit_system);
  if (false == (left_length > 0.0 && right_length > 0.0))
  {
    // one or both of left_length and right_length is a NAN or negative
    ON_ERROR("Invalid input");
    return scale_value;
  }

  // Dale Lear http://mcneel.myjetbrains.com/youtrack/issue/RH-34709
  // Turns out that stripping unit system information when one side is None
  // was a bad idea. After using ON_ScaleValue in the ON_DimStyle
  // class, preserving the unit systems works better when one
  // is None.
  ////if (ON::LengthUnitSystem::None == left_length_unit_system
  ////  && ON::LengthUnitSystem::None != right_length_unit_system
  ////  )
  ////{
  ////  // remove units from right side 
  ////  scale_value.m_right_length = scale_value.m_right_length.RemoveUnitSystem();
  ////  right_length_unit_system = ON::LengthUnitSystem::None;
  ////}

  ////if (ON::LengthUnitSystem::None != left_length_unit_system
  ////  && ON::LengthUnitSystem::None == right_length_unit_system
  ////  )
  ////{
  ////  // remove units from left side 
  ////  scale_value.m_left_length = scale_value.m_left_length.RemoveUnitSystem();
  ////  left_length_unit_system = ON::LengthUnitSystem::None;
  ////}

  const double left_to_right_scale = ON::UnitScale(scale_value.m_left_length.LengthUnitSystem(), scale_value.m_right_length.LengthUnitSystem());
  const double right_to_left_scale = ON::UnitScale(scale_value.m_right_length.LengthUnitSystem(), scale_value.m_left_length.LengthUnitSystem());

  if (false == (left_to_right_scale > 0.0 && right_to_left_scale > 0.0 && 1.0 == ON_InternalDefuzz(1.0e-14,left_to_right_scale*right_to_left_scale)) )
  {
    // one or both of left_to_right_scale and right_to_left_scale is a NAN or not set correctly
    ON_ERROR("Invalid input");
    ON_InternalDefuzz(1.0e-14, left_to_right_scale*right_to_left_scale);
    return scale_value;
  }
  
  double x = left_length;
  double y = right_length;
  if (left_to_right_scale > right_to_left_scale)
    x *= left_to_right_scale;
  else if ( right_to_left_scale > left_to_right_scale)
    y *= right_to_left_scale;

  if (false == (x > 0.0 && y > 0.0))
  {
    // one or both of x and y is a NAN or not set correctly
    ON_ERROR("Invalid input");
    return scale_value;
  }

  if (!ON_Internal_SimplifyRatio(x, y))
    string_format_preference = ON_ScaleValue::ScaleStringFormat::EquationFormat;

  scale_value.m_left_to_right_scale = ON_InternalQuotient(0.0,x,y);
  scale_value.m_right_to_left_scale = ON_InternalQuotient(0.0,y,x);

  if (scale_value.m_left_to_right_scale >= 2.0 && floor(scale_value.m_left_to_right_scale) == scale_value.m_left_to_right_scale)
  {
    scale_value.m_right_to_left_scale = 1.0 / scale_value.m_left_to_right_scale;
  }
  else if (scale_value.m_right_to_left_scale >= 2.0 && floor(scale_value.m_right_to_left_scale) == scale_value.m_right_to_left_scale)
  {
    scale_value.m_left_to_right_scale = 1.0 / scale_value.m_right_to_left_scale;
  }

  switch (string_format_preference)
  {
  case ON_ScaleValue::ScaleStringFormat::RatioFormat:
    // Do NOT dumb down the %.17g in the format string.
    // If you don't like the format, then make your own string and call
    // ON_ScaleValue::CreateFromString(). It is critical that 
    // the values in the formatted string exactly match the double values.
    scale_value.m_scale_as_string.Format(L"%.17g:%.17g", x, y);
    break;
  case ON_ScaleValue::ScaleStringFormat::FractionFormat:
    // Do NOT dumb down the %.17g in the format string.
    // If you don't like the format, then make your own string and call
    // ON_ScaleValue::CreateFromString(). It is critical that 
    // the values in the formatted string exactly match the double values.
    scale_value.m_scale_as_string.Format(L"%.17g/%.17g", x, y);
    break;
  case ON_ScaleValue::ScaleStringFormat::EquationFormat:
    // no break here
  default:
    scale_value.m_scale_as_string.Format(L"%ls = %ls",
      scale_value.m_left_length.LengthAsStringPointer(), 
      scale_value.m_right_length.LengthAsStringPointer()
    );
    break;
  }

  scale_value.m_string_format_preference = string_format_preference;


  return scale_value;
}